

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall cmCPackArchiveGenerator::GetThreadCount(cmCPackArchiveGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  string local_58;
  char *local_38;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CPACK_ARCHIVE_THREADS","");
  bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CPACK_ARCHIVE_THREADS","");
    psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar8 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol(pcVar2,&local_38,10);
    if (local_38 != pcVar2) {
      if (((int)lVar7 != lVar7) || (iVar4 = *piVar6, iVar4 == 0x22)) {
        std::__throw_out_of_range("stoi");
      }
LAB_001e2eba:
      if (iVar4 == 0) {
        *piVar6 = iVar8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      return (int)lVar7;
    }
    std::__throw_invalid_argument("stoi");
  }
  else {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CPACK_THREADS","");
    bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      return 1;
    }
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CPACK_THREADS","");
    psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar8 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol(pcVar2,&local_38,10);
    if (local_38 != pcVar2) {
      if (((int)lVar7 == lVar7) && (iVar4 = *piVar6, iVar4 != 0x22)) goto LAB_001e2eba;
      goto LAB_001e2f01;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001e2f01:
  std::__throw_out_of_range("stoi");
}

Assistant:

int cmCPackArchiveGenerator::GetThreadCount() const
{
  int threads = 1;

  // CPACK_ARCHIVE_THREADS overrides CPACK_THREADS
  if (this->IsSet("CPACK_ARCHIVE_THREADS")) {
    threads = std::stoi(*this->GetOption("CPACK_ARCHIVE_THREADS"));
  } else if (this->IsSet("CPACK_THREADS")) {
    threads = std::stoi(*this->GetOption("CPACK_THREADS"));
  }

  return threads;
}